

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall ON_ClippingPlaneSurface::Dump(ON_ClippingPlaneSurface *this,ON_TextLog *text_log)

{
  undefined8 this_00;
  int iVar1;
  ON_UUID_struct *uuid;
  int local_40;
  int i;
  undefined1 local_30 [8];
  ON_SimpleArray<ON_UUID_struct> uuid_list;
  ON_TextLog *text_log_local;
  ON_ClippingPlaneSurface *this_local;
  
  uuid_list._16_8_ = text_log;
  ON_TextLog::Print(text_log,"Clipping plane surface\n");
  ON_TextLog::PushIndent((ON_TextLog *)uuid_list._16_8_);
  ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,"Enabled = %d",
                    (ulong)((this->m_clipping_plane).m_bEnabled & 1));
  ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,"View IDs =\n");
  ON_TextLog::PushIndent((ON_TextLog *)uuid_list._16_8_);
  ON_SimpleArray<ON_UUID_struct>::ON_SimpleArray((ON_SimpleArray<ON_UUID_struct> *)local_30);
  ON_UuidList::GetUuids
            (&(this->m_clipping_plane).m_viewport_ids,(ON_SimpleArray<ON_UUID_struct> *)local_30);
  local_40 = 0;
  while( true ) {
    iVar1 = ON_SimpleArray<ON_UUID_struct>::Count((ON_SimpleArray<ON_UUID_struct> *)local_30);
    this_00 = uuid_list._16_8_;
    if (iVar1 <= local_40) break;
    uuid = ON_SimpleArray<ON_UUID_struct>::operator[]
                     ((ON_SimpleArray<ON_UUID_struct> *)local_30,local_40);
    ON_TextLog::Print((ON_TextLog *)this_00,uuid);
    ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,"\n");
    local_40 = local_40 + 1;
  }
  ON_TextLog::PopIndent((ON_TextLog *)uuid_list._16_8_);
  ON_SimpleArray<ON_UUID_struct>::~ON_SimpleArray((ON_SimpleArray<ON_UUID_struct> *)local_30);
  ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,"Plane ID = ");
  ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,&(this->m_clipping_plane).m_plane_id);
  ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,"\n");
  ON_TextLog::Print((ON_TextLog *)uuid_list._16_8_,"Plane surface\n");
  ON_TextLog::PushIndent((ON_TextLog *)uuid_list._16_8_);
  ON_PlaneSurface::Dump(&this->super_ON_PlaneSurface,(ON_TextLog *)uuid_list._16_8_);
  ON_TextLog::PopIndent((ON_TextLog *)uuid_list._16_8_);
  ON_TextLog::PopIndent((ON_TextLog *)uuid_list._16_8_);
  return;
}

Assistant:

void ON_ClippingPlaneSurface::Dump( ON_TextLog& text_log ) const
{
  text_log.Print("Clipping plane surface\n");
  text_log.PushIndent();  
  text_log.Print("Enabled = %d",m_clipping_plane.m_bEnabled);
  text_log.Print("View IDs =\n");
  {
    text_log.PushIndent();
    ON_SimpleArray<ON_UUID> uuid_list;
    m_clipping_plane.m_viewport_ids.GetUuids(uuid_list);
    for( int i=0; i<uuid_list.Count(); i++ )
    {
      text_log.Print( uuid_list[i] );
      text_log.Print("\n");
    }
    text_log.PopIndent();
  }
  text_log.Print("Plane ID = ");
  text_log.Print(m_clipping_plane.m_plane_id);
  text_log.Print("\n");  

  text_log.Print("Plane surface\n");
  text_log.PushIndent();  
  ON_PlaneSurface::Dump(text_log);
  text_log.PopIndent();  
  text_log.PopIndent();  
}